

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void flatbuffers::php::PhpGenerator::GenEnum(EnumDef *enum_def,string *code_ptr)

{
  EnumVal *pEVar1;
  string *code_ptr_00;
  EnumDef *__rhs;
  pointer ppEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string *local_108;
  EnumDef *local_100;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    BeginEnum((string *)enum_def,code_ptr);
    for (ppEVar2 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
      pEVar1 = *ppEVar2;
      GenComment(&pEVar1->doc_comment,code_ptr,(CommentConfig *)0x0,Indent_abi_cxx11_);
      EnumMember(enum_def,pEVar1,code_ptr);
    }
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&bStack_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,"private static $names = array(\n");
    local_108 = code_ptr;
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_148);
    ppEVar2 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_100 = enum_def;
    while (__rhs = local_100,
          ppEVar2 !=
          (local_100->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
      pEVar1 = *ppEVar2;
      local_f8 = ppEVar2;
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Indent_abi_cxx11_);
      std::operator+(&local_b0,&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&local_50,&local_b0,"::");
      std::operator+(&local_90,&local_50,&pEVar1->name);
      std::operator+(&local_70,&local_90,"=>");
      std::operator+(&local_f0,&local_70,"\"");
      std::operator+(&local_128,&local_f0,&pEVar1->name);
      std::operator+(&bStack_148,&local_128,"\",\n");
      std::__cxx11::string::append((string *)local_108);
      std::__cxx11::string::~string((string *)&bStack_148);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      ppEVar2 = local_f8 + 1;
    }
    std::operator+(&bStack_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,");\n\n");
    code_ptr_00 = local_108;
    std::__cxx11::string::append((string *)local_108);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::operator+(&bStack_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,"public static function Name($e)\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::operator+(&bStack_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,"{\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_148,&local_128,"if (!isset(self::$names[$e])) {\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&local_128,&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_148,&local_128,"throw new \\Exception();\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_148,&local_128,"}\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_148,&local_128,"return self::$names[$e];\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::operator+(&bStack_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,"}\n");
    std::__cxx11::string::append((string *)code_ptr_00);
    std::__cxx11::string::~string((string *)&bStack_148);
    EndEnum(code_ptr_00);
  }
  return;
}

Assistant:

static void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;

    GenComment(enum_def.doc_comment, code_ptr, nullptr);
    BeginEnum(enum_def.name, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, Indent.c_str());
      EnumMember(enum_def, ev, code_ptr);
    }

    std::string &code = *code_ptr;
    code += "\n";
    code += Indent + "private static $names = array(\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      code += Indent + Indent + enum_def.name + "::" + ev.name + "=>" + "\"" +
              ev.name + "\",\n";
    }

    code += Indent + ");\n\n";
    code += Indent + "public static function Name($e)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "if (!isset(self::$names[$e])) {\n";
    code += Indent + Indent + Indent + "throw new \\Exception();\n";
    code += Indent + Indent + "}\n";
    code += Indent + Indent + "return self::$names[$e];\n";
    code += Indent + "}\n";
    EndEnum(code_ptr);
  }